

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cpp
# Opt level: O2

ssize_t __thiscall create::Serial::send(Serial *this,int __fd,void *__buf,size_t __n,int __flags)

{
  size_t sVar1;
  ssize_t sVar2;
  ostream *poVar3;
  undefined4 in_register_00000034;
  const_buffers_1 local_18;
  
  local_18.super_const_buffer.data_ = (void *)CONCAT44(in_register_00000034,__fd);
  if ((this->port).impl_.implementation_.descriptor_ == -1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"[create::Serial] ");
    poVar3 = std::operator<<(poVar3,"send failed, not connected.");
    std::endl<char,std::char_traits<char>>(poVar3);
    sVar2 = 0;
  }
  else {
    local_18.super_const_buffer.size_ = (ulong)__buf & 0xffffffff;
    sVar1 = boost::asio::
            write<boost::asio::basic_serial_port<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::const_buffers_1>
                      (&this->port,&local_18,(type *)0x0);
    sVar2 = CONCAT71((int7)(sVar1 >> 8),1);
  }
  return sVar2;
}

Assistant:

bool Serial::startReading() {
    if (!connected()) return false;

    if (!data) {
      CERR("[create::Serial] ", "data pointer not initialized.");
      return false;
    }

    // Only allow once
    if (isReading) return true;

    // Start OI
    sendOpcode(OC_START);

    if (!startSensorStream()) return false;

    io.reset();

    // Start continuously reading one byte at a time
    boost::asio::async_read(port,
                            boost::asio::buffer(&byteRead, 1),
                            std::bind(&Serial::onData,
                                      shared_from_this(),
                                      std::placeholders::_1,
                                      std::placeholders::_2));

    ioThread = std::thread(std::bind(
        static_cast<std::size_t(boost::asio::io_service::*)(void)>(
          &boost::asio::io_service::run), &io));

    // Wait for first complete read to finish
    std::unique_lock<std::mutex> lock(dataReadyMut);

    int attempts = 1;
    int maxAttempts = 10;
    while (!dataReady) {
      if (dataReadyCond.wait_for(lock, std::chrono::milliseconds(500)) == std::cv_status::timeout) {
        if (attempts >= maxAttempts) {
          CERR("[create::Serial] ", "failed to receive data from Create. Check if robot is powered!");
          io.stop();
          ioThread.join();
          return false;
        }
        attempts++;

        // Request data again
        sendOpcode(OC_START);
        startSensorStream();
      }
    }

    isReading = true;
    return true;
  }